

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::MaybePickPreferredNetwork(CConnman *this,optional<Network> *network)

{
  optional<Network> net_00;
  bool bVar1;
  ReachableNets *this_00;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_01;
  iterator pvVar2;
  iterator pvVar3;
  reference pvVar4;
  size_t sVar5;
  undefined8 *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  iterator __end1;
  iterator __begin1;
  array<Network,_5UL> *__range1;
  value_type net;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock76;
  array<Network,_5UL> nets;
  FastRandomContext *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  FastRandomContext *in_stack_fffffffffffffea8;
  _Storage<Network,_true> in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  char *pszName;
  FastRandomContext *in_stack_fffffffffffffef8;
  Network *in_stack_ffffffffffffff00;
  Network *in_stack_ffffffffffffff08;
  bool local_d7;
  optional<bool> local_d6;
  value_type local_d4;
  undefined8 local_d0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0] = '\x01';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\x02';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\x03';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\x04';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  local_28[0x10] = '\x05';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  pszName = local_28;
  this_00 = (ReachableNets *)
            std::array<Network,_5UL>::begin((array<Network,_5UL> *)in_stack_fffffffffffffe98);
  this_01 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
            std::array<Network,_5UL>::end((array<Network,_5UL> *)in_stack_fffffffffffffe98);
  FastRandomContext::FastRandomContext(in_stack_fffffffffffffea8,(bool)in_stack_fffffffffffffea7);
  std::shuffle<Network*,FastRandomContext>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  FastRandomContext::~FastRandomContext(in_stack_fffffffffffffe98);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_01,(AnnotatedMixin<std::recursive_mutex> *)this_00,pszName,in_RDI,
             in_stack_fffffffffffffebc,SUB41((uint)in_stack_fffffffffffffeb8 >> 0x18,0));
  pvVar2 = std::array<Network,_5UL>::begin((array<Network,_5UL> *)in_stack_fffffffffffffe98);
  pvVar3 = std::array<Network,_5UL>::end((array<Network,_5UL> *)in_stack_fffffffffffffe98);
  do {
    if (pvVar2 == pvVar3) {
      local_d7 = false;
LAB_0021472d:
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_d7;
    }
    local_d4 = *pvVar2;
    bVar1 = ReachableNets::Contains(this_00,(Network)((ulong)this_01 >> 0x20));
    in_stack_fffffffffffffebc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffebc);
    if ((bVar1) &&
       (pvVar4 = std::array<unsigned_int,_7UL>::operator[]
                           ((array<unsigned_int,_7UL> *)in_stack_fffffffffffffea8,
                            CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)),
       *pvVar4 == 0)) {
      in_stack_fffffffffffffea8 = *(FastRandomContext **)(in_RDI + 0xb0);
      std::optional<Network>::optional<const_Network_&,_true>
                ((optional<Network> *)in_stack_fffffffffffffea8,
                 (Network *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      std::optional<bool>::optional(&local_d6);
      net_00.super__Optional_base<Network,_true,_true>._M_payload.
      super__Optional_payload_base<Network>._4_4_ = in_stack_fffffffffffffebc;
      net_00.super__Optional_base<Network,_true,_true>._M_payload.
      super__Optional_payload_base<Network>._M_payload._M_value = in_stack_fffffffffffffeb8._M_value
      ;
      sVar5 = AddrMan::Size((AddrMan *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)
                            ,net_00,(_Optional_base<bool,_true,_true>)
                                    SUB82((ulong)in_stack_fffffffffffffea8 >> 0x30,0));
      if (sVar5 != 0) {
        std::optional<Network>::optional<const_Network_&,_true>
                  ((optional<Network> *)in_stack_fffffffffffffea8,
                   (Network *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
        *in_RSI = local_d0;
        local_d7 = true;
        goto LAB_0021472d;
      }
    }
    pvVar2 = pvVar2 + 1;
  } while( true );
}

Assistant:

bool CConnman::MaybePickPreferredNetwork(std::optional<Network>& network)
{
    std::array<Network, 5> nets{NET_IPV4, NET_IPV6, NET_ONION, NET_I2P, NET_CJDNS};
    std::shuffle(nets.begin(), nets.end(), FastRandomContext());

    LOCK(m_nodes_mutex);
    for (const auto net : nets) {
        if (g_reachable_nets.Contains(net) && m_network_conn_counts[net] == 0 && addrman.Size(net) != 0) {
            network = net;
            return true;
        }
    }

    return false;
}